

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pruned_grid.hpp
# Opt level: O3

spherical_grid_ptr __thiscall
IntegratorXX::detail::
make_pruned_grid<IntegratorXX::RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,double>,IntegratorXX::TreutlerAhlrichsRadialTraits>>
          (detail *this,
          RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,_double>,_IntegratorXX::TreutlerAhlrichsRadialTraits>
          *rq,vector<IntegratorXX::PruningRegion,_std::allocator<IntegratorXX::PruningRegion>_>
              *pruning_regions)

{
  AngularQuad AVar1;
  pointer pPVar2;
  runtime_error *this_00;
  pointer pPVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  spherical_grid_ptr sVar5;
  
  pPVar3 = (pruning_regions->
           super__Vector_base<IntegratorXX::PruningRegion,_std::allocator<IntegratorXX::PruningRegion>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pPVar2 = (pruning_regions->
           super__Vector_base<IntegratorXX::PruningRegion,_std::allocator<IntegratorXX::PruningRegion>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pPVar2 != pPVar3) {
    AVar1 = pPVar3->angular_quad;
    do {
      if (pPVar3->angular_quad != AVar1) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"Mixed Angular Pruning Not Supported");
        goto LAB_0019aa88;
      }
      pPVar3 = pPVar3 + 1;
    } while (pPVar3 != pPVar2);
    switch(AVar1 << 0x18 | AVar1 - AhrensBeylkin >> 8) {
    case 0:
      sVar5 = make_pruned_grid_impl<IntegratorXX::AhrensBeylkin<double>,IntegratorXX::RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,double>,IntegratorXX::TreutlerAhlrichsRadialTraits>>
                        (this,rq,pruning_regions);
      _Var4 = sVar5.
              super___shared_ptr<IntegratorXX::SphericalQuadratureBase<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi;
      break;
    case 1:
      sVar5 = make_pruned_grid_impl<IntegratorXX::Delley<double>,IntegratorXX::RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,double>,IntegratorXX::TreutlerAhlrichsRadialTraits>>
                        (this,rq,pruning_regions);
      _Var4 = sVar5.
              super___shared_ptr<IntegratorXX::SphericalQuadratureBase<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi;
      break;
    case 2:
      sVar5 = make_pruned_grid_impl<IntegratorXX::LebedevLaikov<double>,IntegratorXX::RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,double>,IntegratorXX::TreutlerAhlrichsRadialTraits>>
                        (this,rq,pruning_regions);
      _Var4 = sVar5.
              super___shared_ptr<IntegratorXX::SphericalQuadratureBase<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi;
      break;
    case 3:
      sVar5 = make_pruned_grid_impl<IntegratorXX::Womersley<double>,IntegratorXX::RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,double>,IntegratorXX::TreutlerAhlrichsRadialTraits>>
                        (this,rq,pruning_regions);
      _Var4 = sVar5.
              super___shared_ptr<IntegratorXX::SphericalQuadratureBase<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi;
      break;
    default:
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Unsupported Angular Quadrature");
      goto LAB_0019aa88;
    }
    sVar5.
    super___shared_ptr<IntegratorXX::SphericalQuadratureBase<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = _Var4._M_pi;
    sVar5.
    super___shared_ptr<IntegratorXX::SphericalQuadratureBase<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)this;
    return (spherical_grid_ptr)
           sVar5.
           super___shared_ptr<IntegratorXX::SphericalQuadratureBase<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"No Pruning Regions");
LAB_0019aa88:
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

auto make_pruned_grid(const RadialQuadType& rq, 
  const std::vector<PruningRegion>& pruning_regions) {

  if(pruning_regions.size() == 0)
    throw std::runtime_error("No Pruning Regions");

  auto angular_quad = pruning_regions[0].angular_quad;
  for(auto r : pruning_regions) {
    if(r.angular_quad != angular_quad)
      throw std::runtime_error("Mixed Angular Pruning Not Supported");
  }

  switch(angular_quad) {
    case AngularQuad::AhrensBeylkin:
      return make_pruned_grid_impl<ah_type>(rq, pruning_regions);
    case AngularQuad::Delley:
      return make_pruned_grid_impl<de_type>(rq, pruning_regions);
    case AngularQuad::LebedevLaikov:
      return make_pruned_grid_impl<ll_type>(rq, pruning_regions);
    case AngularQuad::Womersley:
      return make_pruned_grid_impl<wo_type>(rq, pruning_regions);
    default:
      throw std::runtime_error("Unsupported Angular Quadrature");
      abort();
  }
  

}